

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

void __thiscall ClipperLib::Clipper::ClearHorzJoins(Clipper *this)

{
  size_type sVar1;
  reference ppHVar2;
  ulong local_18;
  size_type i;
  Clipper *this_local;
  
  local_18 = 0;
  while( true ) {
    sVar1 = std::vector<ClipperLib::HorzJoinRec_*,_std::allocator<ClipperLib::HorzJoinRec_*>_>::size
                      (&this->m_HorizJoins);
    if (sVar1 <= local_18) break;
    ppHVar2 = std::vector<ClipperLib::HorzJoinRec_*,_std::allocator<ClipperLib::HorzJoinRec_*>_>::
              operator[](&this->m_HorizJoins,local_18);
    if (*ppHVar2 != (value_type)0x0) {
      operator_delete(*ppHVar2);
    }
    local_18 = local_18 + 1;
  }
  std::vector<ClipperLib::HorzJoinRec_*,_std::allocator<ClipperLib::HorzJoinRec_*>_>::resize
            (&this->m_HorizJoins,0);
  return;
}

Assistant:

void Clipper::ClearHorzJoins()
{
  for (HorzJoinList::size_type i = 0; i < m_HorizJoins.size(); i++)
    delete m_HorizJoins[i];
  m_HorizJoins.resize(0);
}